

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O1

int Curl_pgrsUpdate(Curl_easy *data)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  FILE *whereto;
  undefined1 auVar4 [12];
  undefined8 uVar5;
  undefined4 uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  timediff_t tVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  curl_off_t seconds;
  int iVar16;
  curltime older;
  curltime newer;
  curltime newer_00;
  curltime cVar17;
  long local_a8;
  long local_a0;
  char local_96 [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  
  cVar17 = Curl_now();
  lVar14 = cVar17.tv_sec;
  uVar5 = (data->progress).start.tv_sec;
  uVar6 = (data->progress).start.tv_usec;
  older.tv_usec = uVar6;
  older.tv_sec = uVar5;
  older._12_4_ = 0;
  auVar4 = cVar17._0_12_;
  newer._12_4_ = 0;
  newer.tv_sec = auVar4._0_8_;
  newer.tv_usec = auVar4._8_4_;
  uVar8 = Curl_timediff_us(newer,older);
  (data->progress).timespent = uVar8;
  uVar15 = (data->progress).downloaded;
  if ((long)uVar8 < 1) {
    uVar9 = uVar15 * 1000000;
  }
  else if ((long)uVar15 < 0x8637bd05af6) {
    uVar9 = (long)(uVar15 * 1000000) / (long)uVar8;
  }
  else if ((long)uVar8 < 1000000) {
    uVar9 = 0x7fffffffffffffff;
  }
  else {
    uVar9 = uVar15 / (uVar8 / 1000000);
  }
  (data->progress).dlspeed = uVar9;
  uVar3 = (data->progress).uploaded;
  if ((long)uVar8 < 1) {
    uVar8 = uVar3 * 1000000;
  }
  else if ((long)uVar3 < 0x8637bd05af6) {
    uVar8 = (long)(uVar3 * 1000000) / (long)uVar8;
  }
  else if ((long)uVar8 < 1000000) {
    uVar8 = 0x7fffffffffffffff;
  }
  else {
    uVar8 = uVar3 / (uVar8 / 1000000);
  }
  (data->progress).ulspeed = uVar8;
  lVar12 = (data->progress).lastshow;
  if (lVar12 != lVar14) {
    iVar7 = (data->progress).speeder_c;
    iVar16 = iVar7 % 6;
    (data->progress).lastshow = lVar14;
    (data->progress).speeder[iVar16] = uVar3 + uVar15;
    (data->progress).speeder_time[iVar16].tv_sec = lVar14;
    (data->progress).speeder_time[iVar16].tv_usec = cVar17.tv_usec;
    (data->progress).speeder_c = iVar7 + 1U;
    if (iVar7 == 0) {
      lVar13 = uVar8 + uVar9;
    }
    else {
      uVar15 = 0;
      if (4 < iVar7) {
        uVar15 = (ulong)((iVar7 + 1U) % 6);
      }
      uVar8 = (ulong)(uint)((int)uVar15 << 4);
      cVar17.tv_usec = *(undefined4 *)((long)&(data->progress).speeder_time[0].tv_usec + uVar8);
      cVar17.tv_sec = *(undefined8 *)((long)&(data->progress).speeder_time[0].tv_sec + uVar8);
      cVar17._12_4_ = 0;
      newer_00._12_4_ = 0;
      newer_00.tv_sec = auVar4._0_8_;
      newer_00.tv_usec = auVar4._8_4_;
      tVar10 = Curl_timediff(newer_00,cVar17);
      lVar13 = tVar10 + (ulong)(tVar10 == 0);
      lVar11 = (data->progress).speeder[iVar16] - (data->progress).speeder[uVar15];
      if (lVar11 < 0x418938) {
        lVar13 = (lVar11 * 1000) / lVar13;
      }
      else {
        lVar13 = (long)((double)lVar11 / ((double)lVar13 / 1000.0));
      }
    }
    (data->progress).current_speed = lVar13;
  }
  if (((data->progress).flags & 0x10) != 0) {
    return 0;
  }
  if ((data->set).fxferinfo == (curl_xferinfo_callback)0x0) {
    if ((data->set).fprogress != (curl_progress_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar7 = (*(data->set).fprogress)
                        ((data->set).progress_client,(double)(data->progress).size_dl,
                         (double)(data->progress).downloaded,(double)(data->progress).size_ul,
                         (double)(data->progress).uploaded);
      goto LAB_005eb276;
    }
  }
  else {
    Curl_set_in_callback(data,true);
    iVar7 = (*(data->set).fxferinfo)
                      ((data->set).progress_client,(data->progress).size_dl,
                       (data->progress).downloaded,(data->progress).size_ul,
                       (data->progress).uploaded);
LAB_005eb276:
    Curl_set_in_callback(data,false);
    if (iVar7 == 0) {
      return 0;
    }
    if (iVar7 != 0x10000001) {
      Curl_failf(data,"Callback aborted");
      return iVar7;
    }
  }
  if (lVar12 == lVar14) {
    return 0;
  }
  lVar14 = (data->progress).timespent;
  if (((data->progress).flags & 0x80) == 0) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n");
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    piVar1 = &(data->progress).flags;
    *(byte *)piVar1 = (byte)*piVar1 | 0x80;
  }
  lVar14 = lVar14 / 1000000;
  uVar2 = (data->progress).flags;
  if (((uVar2 & 0x20) == 0) || (lVar12 = (data->progress).ulspeed, lVar12 < 1)) {
    lVar12 = 0;
LAB_005eb37a:
    local_a0 = 0;
  }
  else {
    uVar15 = (data->progress).size_ul;
    lVar12 = (long)uVar15 / lVar12;
    if ((long)uVar15 < 0x2711) {
      if ((long)uVar15 < 1) goto LAB_005eb37a;
      local_a0 = (data->progress).uploaded * 100;
    }
    else {
      local_a0 = (data->progress).uploaded;
      uVar15 = uVar15 / 100;
    }
    local_a0 = local_a0 / (long)uVar15;
  }
  if (((uVar2 & 0x40) == 0) || (lVar13 = (data->progress).dlspeed, lVar13 < 1)) {
    lVar13 = 0;
LAB_005eb3f6:
    local_a8 = 0;
  }
  else {
    uVar15 = (data->progress).size_dl;
    lVar13 = (long)uVar15 / lVar13;
    if ((long)uVar15 < 0x2711) {
      if ((long)uVar15 < 1) goto LAB_005eb3f6;
      local_a8 = (data->progress).downloaded * 100;
    }
    else {
      local_a8 = (data->progress).downloaded;
      uVar15 = uVar15 / 100;
    }
    local_a8 = local_a8 / (long)uVar15;
  }
  if (lVar13 < lVar12) {
    lVar13 = lVar12;
  }
  seconds = 0;
  if (0 < lVar13) {
    seconds = lVar13 - lVar14;
  }
  time2str(time_left,seconds);
  time2str(time_total,lVar13);
  time2str(local_96,lVar14);
  uVar2 = (data->progress).flags;
  uVar15 = (&(data->progress).size_dl)[(ulong)((uVar2 & 0x40) == 0) * 2] +
           (&(data->progress).size_ul)[(ulong)((uVar2 & 0x20) == 0) * 2];
  lVar14 = (data->progress).uploaded + (data->progress).downloaded;
  if ((long)uVar15 < 0x2711) {
    if ((long)uVar15 < 1) {
      lVar14 = 0;
    }
    else {
      lVar14 = (lVar14 * 100) / (long)uVar15;
    }
  }
  else {
    lVar14 = lVar14 / (long)(uVar15 / 100);
  }
  whereto = (data->set).err;
  max5data(uVar15,max5[2]);
  max5data((data->progress).downloaded,max5[0]);
  max5data((data->progress).uploaded,max5[1]);
  max5data((data->progress).dlspeed,max5[3]);
  max5data((data->progress).ulspeed,max5[4]);
  max5data((data->progress).current_speed,max5[5]);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",lVar14,max5 + 2,local_a8,
                max5,local_a0,max5 + 1,max5 + 3,max5 + 4,time_total,local_96,time_left,max5 + 5);
  fflush((FILE *)(data->set).err);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct Curl_easy *data)
{
  struct curltime now = Curl_now(); /* what time is it */
  bool showprogress = progress_calc(data, now);
  if(!(data->progress.flags & PGRS_HIDE)) {
    if(data->set.fxferinfo) {
      int result;
      /* There's a callback set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fxferinfo(data->set.progress_client,
                                   data->progress.size_dl,
                                   data->progress.downloaded,
                                   data->progress.size_ul,
                                   data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result != CURL_PROGRESSFUNC_CONTINUE) {
        if(result)
          failf(data, "Callback aborted");
        return result;
      }
    }
    else if(data->set.fprogress) {
      int result;
      /* The older deprecated callback is set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fprogress(data->set.progress_client,
                                   (double)data->progress.size_dl,
                                   (double)data->progress.downloaded,
                                   (double)data->progress.size_ul,
                                   (double)data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result != CURL_PROGRESSFUNC_CONTINUE) {
        if(result)
          failf(data, "Callback aborted");
        return result;
      }
    }

    if(showprogress)
      progress_meter(data);
  }

  return 0;
}